

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

tree_node * __thiscall RegexTree::build_block(RegexTree *this,char *str,int num)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  tree_node *ptVar5;
  tree_node *ptVar6;
  tree_node *ptVar7;
  tree_node *block;
  tree_node *cat_2;
  tree_node *cat_1;
  int blen_2;
  tree_node *right_side_1;
  tree_node *_or_1;
  tree_node *tmp_3;
  tree_node *ptStack_90;
  int blen_1;
  tree_node *right_side;
  tree_node *star_3;
  tree_node *cat;
  tree_node *star_2;
  tree_node *tmp_2;
  tree_node *star_1;
  tree_node *_or;
  tree_node *tmp_1;
  tree_node *epsilon;
  tree_node *star;
  tree_node *tmp;
  char ch;
  int blen;
  bool escape;
  tree_node *ptStack_28;
  int i;
  tree_node *curr;
  int num_local;
  char *str_local;
  RegexTree *this_local;
  
  bVar1 = false;
  if ((*str == '\\') || (*str == '(')) {
    if (*str == '\\') {
      ptStack_28 = (tree_node *)operator_new(0x18);
      tree_node::tree_node(ptStack_28);
      ptStack_28->c = '\x11';
      ptVar5 = (tree_node *)operator_new(0x18);
      tree_node::tree_node(ptVar5);
      ptStack_28->left = ptVar5;
      cVar2 = parse_escape(str[1]);
      ptStack_28->left->c = cVar2;
      blen = 2;
    }
    else {
      iVar4 = block_len(this,str + 1);
      ptStack_28 = build_block(this,str + 1,iVar4 + -1);
      blen = iVar4 + 1;
    }
  }
  else {
    ptStack_28 = (tree_node *)operator_new(0x18);
    tree_node::tree_node(ptStack_28);
    ptStack_28->c = '\x11';
    ptVar5 = (tree_node *)operator_new(0x18);
    tree_node::tree_node(ptVar5);
    ptStack_28->left = ptVar5;
    ptStack_28->left->c = *str;
    blen = 1;
  }
  do {
    if (num <= blen) {
      ptVar5 = (tree_node *)operator_new(0x18);
      tree_node::tree_node(ptVar5);
      ptVar5->c = '\x11';
      ptVar5->left = ptStack_28;
      return ptVar5;
    }
    if ((str[blen] != '\\') || (bVar1)) {
      if (bVar1) {
        tmp._3_1_ = parse_escape(str[blen]);
      }
      else {
        tmp._3_1_ = parse_control(str[blen]);
      }
      bVar1 = false;
      switch(tmp._3_1_) {
      case '\t':
        bVar3 = isBlock(this,ptStack_28);
        if (bVar3) {
          ptStack_28->c = '\t';
        }
        else {
          ptVar5 = ptStack_28->right;
          bVar3 = isBlock(this,ptVar5);
          if (bVar3) {
            ptVar5->c = '\t';
          }
          else {
            ptVar7 = (tree_node *)operator_new(0x18);
            tree_node::tree_node(ptVar7);
            ptVar7->c = '\t';
            ptVar7->left = ptVar5;
            ptStack_28->right = ptVar7;
          }
        }
        break;
      case '\n':
        if ((str[blen + 1] == '\\') || (str[blen + 1] == '(')) {
          if (str[blen + 1] == '\\') {
            ptStack_90 = (tree_node *)operator_new(0x18);
            tree_node::tree_node(ptStack_90);
            cVar2 = parse_escape(str[blen + 2]);
            ptStack_90->c = cVar2;
            blen = blen + 2;
          }
          else {
            iVar4 = block_len(this,str + (long)blen + 2);
            ptStack_90 = build_block(this,str + (long)blen + 2,iVar4 + -1);
            blen = iVar4 + 1 + blen;
          }
        }
        else {
          ptStack_90 = (tree_node *)operator_new(0x18);
          tree_node::tree_node(ptStack_90);
          ptStack_90->c = str[blen + 1];
          blen = blen + 1;
        }
        bVar3 = isBlock(this,ptStack_28);
        if (bVar3) {
          ptStack_28->c = '\n';
          ptStack_28->right = ptStack_90;
        }
        else {
          ptVar5 = ptStack_28->right;
          bVar3 = isBlock(this,ptVar5);
          if (bVar3) {
            ptVar5->c = '\n';
            ptVar5->right = ptStack_90;
          }
          else {
            ptVar7 = (tree_node *)operator_new(0x18);
            tree_node::tree_node(ptVar7);
            ptVar7->c = '\n';
            ptVar7->left = ptVar5;
            ptStack_28->right = ptVar7;
            ptVar7->right = ptStack_90;
          }
        }
        break;
      case '\v':
        bVar3 = isBlock(this,ptStack_28);
        if (bVar3) {
          ptStack_28->c = '\b';
          ptVar5 = (tree_node *)operator_new(0x18);
          tree_node::tree_node(ptVar5);
          ptVar5->c = '\t';
          ptVar7 = copy_tree(this,ptStack_28->left);
          ptVar5->left = ptVar7;
          ptStack_28->right = ptVar5;
        }
        else {
          ptVar5 = ptStack_28->right;
          bVar3 = isBlock(this,ptVar5);
          if (bVar3) {
            ptVar5->c = '\b';
            ptVar7 = (tree_node *)operator_new(0x18);
            tree_node::tree_node(ptVar7);
            ptVar7->c = '\t';
            ptVar6 = copy_tree(this,ptVar5->left);
            ptVar7->left = ptVar6;
            ptVar5->right = ptVar7;
          }
          else {
            ptVar7 = (tree_node *)operator_new(0x18);
            tree_node::tree_node(ptVar7);
            ptVar7->c = '\b';
            ptVar6 = (tree_node *)operator_new(0x18);
            tree_node::tree_node(ptVar6);
            ptVar6->c = '\t';
            ptVar7->right = ptVar6;
            ptVar7->left = ptVar5;
            ptVar5 = copy_tree(this,ptVar5);
            ptVar6->left = ptVar5;
            ptStack_28->right = ptVar7;
          }
        }
        break;
      case '\f':
        ptVar5 = (tree_node *)operator_new(0x18);
        tree_node::tree_node(ptVar5);
        ptVar5->c = '\a';
        bVar3 = isBlock(this,ptStack_28);
        if (bVar3) {
          ptStack_28->c = '\n';
          ptStack_28->right = ptVar5;
        }
        else {
          ptVar7 = ptStack_28->right;
          bVar3 = isBlock(this,ptVar7);
          if (bVar3) {
            ptVar7->c = '\n';
            ptVar7->right = ptVar5;
          }
          else {
            ptVar6 = (tree_node *)operator_new(0x18);
            tree_node::tree_node(ptVar6);
            ptVar6->c = '\n';
            ptVar6->left = ptVar7;
            ptVar6->right = ptVar5;
            ptStack_28->right = ptVar6;
          }
        }
        break;
      case '\x10':
      default:
        if (ptStack_28->c == '\x11') {
          ptStack_28->c = '\b';
        }
        else {
          ptVar5 = (tree_node *)operator_new(0x18);
          tree_node::tree_node(ptVar5);
          ptVar5->c = '\b';
          ptVar5->left = ptStack_28;
          ptStack_28 = ptVar5;
        }
        ptVar5 = (tree_node *)operator_new(0x18);
        tree_node::tree_node(ptVar5);
        ptStack_28->right = ptVar5;
        ptStack_28->right->c = tmp._3_1_;
        break;
      case '\x11':
        iVar4 = block_len(this,str + (long)blen + 1);
        ptVar5 = build_block(this,str + (long)blen + 1,iVar4 + -1);
        bVar3 = isBlock(this,ptStack_28);
        if (bVar3) {
          ptStack_28->c = '\b';
          ptStack_28->right = ptVar5;
        }
        else {
          ptVar7 = (tree_node *)operator_new(0x18);
          tree_node::tree_node(ptVar7);
          ptVar7->c = '\b';
          ptVar7->left = ptStack_28;
          ptVar7->right = ptVar5;
          ptStack_28 = ptVar7;
        }
        blen = iVar4 + blen;
      }
    }
    else {
      bVar1 = true;
    }
    blen = blen + 1;
  } while( true );
}

Assistant:

tree_node *RegexTree::build_block(const char *str, int num) {
    tree_node *curr;
    int i = 0;
    bool escape = false;

    if (str[i] != '\\' && str[i] != '(') {
        curr = new tree_node;
        curr->c = BLOCK;

        curr->left = new tree_node;
        curr->left->c = str[i];
        i++;
    } else if (str[i] == '\\') {
        curr = new tree_node;
        curr->c = BLOCK;

        curr->left = new tree_node;
        curr->left->c = parse_escape(str[i + 1]);
        i += 2;
    } else {
        int blen = block_len(str + 1);
        curr = build_block(str + 1, blen - 1);
        i += blen + 1;
    }


    for (; i < num; i++) {
        char ch = str[i];
        if (str[i] == '\\' && !escape) {
            escape = true;
            continue;
        }

        if (!escape) {
            ch = parse_control(ch);
        } else {
            ch = parse_escape(ch);
        }

        escape = false;
        switch (ch) {
            case STAR: {
                if (isBlock(curr))
                    curr->c = STAR;
                else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp))
                        tmp->c = STAR;
                    else {
                        tree_node *star = new tree_node;
                        star->c = STAR;
                        star->left = tmp;
                        curr->right = star;
                    }
                }
                break;
            }
            case QUESTION: {
                tree_node *epsilon = new tree_node;
                epsilon->c = EPSILON;
                if (isBlock(curr)) {
                    curr->c = OR;
                    curr->right = epsilon;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = OR;
                        tmp->right = epsilon;
                    } else {
                        tree_node *_or = new tree_node;
                        _or->c = OR;
                        _or->left = tmp;
                        _or->right = epsilon;
                        curr->right = _or;
                    }
                }
                break;
            }
            case PLUS: {
                if (isBlock(curr)) {
                    curr->c = CAT;

                    tree_node *star = new tree_node;
                    star->c = STAR;
                    star->left = copy_tree(curr->left);
                    curr->right = star;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = CAT;

                        tree_node *star = new tree_node;
                        star->c = STAR;
                        star->left = copy_tree(tmp->left);
                        tmp->right = star;
                    } else {
                        tree_node *cat = new tree_node;
                        cat->c = CAT;

                        tree_node *star = new tree_node;
                        star->c = STAR;

                        cat->right = star;
                        cat->left = tmp;

                        star->left = copy_tree(tmp);
                        curr->right = cat;
                    }
                }
                break;
            }
            case OR: {
                tree_node *right_side;
                if (str[i + 1] != '\\' && str[i + 1] != '(') { // normal char
                    right_side = new tree_node;
                    right_side->c = str[i + 1];
                    i++;
                } else if (str[i + 1] == '\\') { // escape char
                    right_side = new tree_node;
                    right_side->c = parse_escape(str[i + 2]);
                    i += 2;
                } else { // a block
                    int blen = block_len(str + i + 2);
                    right_side = build_block(str + i + 2, blen - 1);
                    i += blen + 1;
                }

                if (isBlock(curr)) {
                    curr->c = OR;
                    curr->right = right_side;
                } else {
                    tree_node *tmp = curr->right;
                    if (isBlock(tmp)) {
                        tmp->c = OR;
                        tmp->right = right_side;
                    } else {
                        tree_node *_or = new tree_node;
                        _or->c = OR;
                        _or->left = tmp;

                        curr->right = _or;
                        _or->right = right_side;
                    }
                }
                break;
            }
            case BLOCK: {
                tree_node *right_side;
                int blen = block_len(str + i + 1);
                right_side = build_block(str + i + 1, blen - 1);
                if (isBlock(curr)) {
                    curr->c = CAT;
                    curr->right = right_side;
                } else {
                    tree_node *cat = new tree_node;
                    cat->c = CAT;
                    cat->left = curr;
                    curr = cat;
                    curr->right = right_side;
                }
                i += blen;
                break;
            }

            case WILDCARD:
            default: {
                if (curr->c == BLOCK)
                    curr->c = CAT;
                else {
                    tree_node *cat = new tree_node;
                    cat->c = CAT;
                    cat->left = curr;
                    curr = cat;
                }
                curr->right = new tree_node;
                curr->right->c = ch;
                break;
            }
        }
    }

    tree_node *block = new tree_node;
    block->c = BLOCK;
    block->left = curr;
    return block;
}